

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers_iforest.hpp
# Opt level: O2

void calc_ranges_all_cols<InputData<float,int>,WorkerMemory<ImputedData<int,double>,double,float>>
               (InputData<float,_int> *input_data,
               WorkerMemory<ImputedData<int,_double>,_double,_float> *workspace,
               ModelParams *model_params,double *ranges,double *saved_xmin,double *saved_xmax)

{
  ColumnSampler<double> *this;
  size_t *col;
  bool bVar1;
  size_t sVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  this = &workspace->col_sampler;
  ColumnSampler<double>::prepare_full_pass(this);
  col = &workspace->col_chosen;
  do {
    bVar1 = ColumnSampler<double>::sample_col(this,col);
    if (!bVar1) {
      return;
    }
    get_split_range<InputData<float,int>,WorkerMemory<ImputedData<int,double>,double,float>>
              (workspace,input_data,model_params);
    if (workspace->unsplittable == true) {
      ColumnSampler<double>::drop_col(this,*col);
      sVar2 = *col;
      ranges[sVar2] = 0.0;
      dVar3 = 0.0;
      dVar4 = 0.0;
    }
    else {
      dVar3 = workspace->xmin;
      dVar4 = workspace->xmax;
      sVar2 = workspace->col_chosen;
      ranges[sVar2] = dVar4 - dVar3;
      if (workspace->tree_kurtoses == (double *)0x0) {
        if (input_data->col_weights == (float *)0x0) goto LAB_0023fd6f;
        dVar5 = (double)input_data->col_weights[sVar2];
      }
      else {
        dVar5 = workspace->tree_kurtoses[sVar2];
      }
      dVar5 = (dVar4 - dVar3) * dVar5;
      if (dVar5 <= 1e-100) {
        dVar5 = 1e-100;
      }
      ranges[sVar2] = dVar5;
    }
LAB_0023fd6f:
    if (saved_xmin != (double *)0x0) {
      saved_xmin[sVar2] = dVar3;
      saved_xmax[sVar2] = dVar4;
    }
  } while( true );
}

Assistant:

void calc_ranges_all_cols(InputData &input_data, WorkerMemory &workspace, ModelParams &model_params,
                          double *restrict ranges, double *restrict saved_xmin, double *restrict saved_xmax)
{
    workspace.col_sampler.prepare_full_pass();
    while (workspace.col_sampler.sample_col(workspace.col_chosen))
    {
        get_split_range(workspace, input_data, model_params);

        if (workspace.unsplittable) {
            workspace.col_sampler.drop_col(workspace.col_chosen);
            ranges[workspace.col_chosen] = 0;
            if (saved_xmin != NULL) {
                saved_xmin[workspace.col_chosen] = 0;
                saved_xmax[workspace.col_chosen] = 0;
            }
        }
        else {
            ranges[workspace.col_chosen] = workspace.xmax - workspace.xmin;
            if (workspace.tree_kurtoses != NULL) {
                ranges[workspace.col_chosen] *= workspace.tree_kurtoses[workspace.col_chosen];
                ranges[workspace.col_chosen] = std::fmax(ranges[workspace.col_chosen], 1e-100);
            }
            else if (input_data.col_weights != NULL) {
                ranges[workspace.col_chosen] *= input_data.col_weights[workspace.col_chosen];
                ranges[workspace.col_chosen] = std::fmax(ranges[workspace.col_chosen], 1e-100);
            }
            if (saved_xmin != NULL) {
                saved_xmin[workspace.col_chosen] = workspace.xmin;
                saved_xmax[workspace.col_chosen] = workspace.xmax;
            }
        }
    }
}